

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O2

Variable * getVariableOrCrash(Object *object)

{
  int iVar1;
  Variable *pVVar2;
  runtime_error *this;
  
  if (object == (Object *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ScriptUtils::getVariableOrCrash => object is null!");
  }
  else {
    iVar1 = (**object->_vptr_Object)();
    if ((char)iVar1 == '\x02') {
      pVVar2 = (Variable *)__dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
      return pVVar2;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ScriptUtils::getVariableOrCrash => wrong type!");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable* getVariableOrCrash(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getVariableOrCrash => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_VARIABLE) {
		return dynamic_cast<Variable *>(object);
	} else {
		throw std::runtime_error("ScriptUtils::getVariableOrCrash => wrong type!");
	}
}